

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void jmp_dropval(FuncState *fs,BCPos list)

{
  long lVar1;
  BCPos pc;
  ulong uVar2;
  
  uVar2 = (ulong)list;
  while (pc = (BCPos)uVar2, pc != 0xffffffff) {
    jmp_patchtestreg(fs,pc,0xff);
    lVar1 = (ulong)*(ushort *)((long)&fs->bcbase[uVar2].ins + 2) - 0x8000;
    uVar2 = (ulong)(pc + 1 + (int)lVar1);
    if (lVar1 == -1) {
      uVar2 = 0xffffffff;
    }
  }
  return;
}

Assistant:

static void jmp_dropval(FuncState *fs, BCPos list)
{
  for (; list != NO_JMP; list = jmp_next(fs, list))
    jmp_patchtestreg(fs, list, NO_REG);
}